

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O1

rotation_t *
opengv::relative_pose::ge
          (rotation_t *__return_storage_ptr__,RelativeAdapterBase *adapter,Indices *indices,
          geOutput_t *output,bool useWeights)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  size_t sVar4;
  byte bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  double *pdVar45;
  ulong uVar46;
  long lVar47;
  ulong uVar48;
  long lVar49;
  ulong uVar50;
  int iVar51;
  ulong uVar52;
  int iVar53;
  size_t sVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  double dVar61;
  double dVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  double dVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  double dVar72;
  double dVar73;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  double dVar80;
  double dVar81;
  undefined1 auVar79 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 in_ZMM4 [64];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  double dVar91;
  sub local_13ca;
  false_type local_13c9;
  MatrixXd Hcross;
  rotation_t startingRotation;
  double dStack_1330;
  double local_1328;
  double dStack_1320;
  double dStack_1318;
  double dStack_1310;
  double dStack_1308;
  double dStack_1300;
  double dStack_12f8;
  double dStack_12f0;
  double local_12e8;
  double dStack_12e0;
  double dStack_12d8;
  double dStack_12d0;
  double dStack_12c8;
  double dStack_12c0;
  double dStack_12b8;
  double dStack_12b0;
  double local_12a8;
  double dStack_12a0;
  double local_1298;
  double dStack_1290;
  double local_1288;
  double dStack_1280;
  double local_1278;
  double dStack_1270;
  double dStack_1268;
  double dStack_1260;
  double dStack_1258;
  double dStack_1250;
  double dStack_1248;
  double dStack_1240;
  double local_1238;
  double dStack_1230;
  double dStack_1228;
  double dStack_1220;
  double dStack_1218;
  double dStack_1210;
  double dStack_1208;
  double dStack_1200;
  double local_11f8;
  double dStack_11f0;
  double dStack_11e8;
  double dStack_11e0;
  double local_11d8;
  double dStack_11d0;
  double local_11c8;
  double dStack_11c0;
  double local_11b8;
  double dStack_11b0;
  double local_11a8;
  double dStack_11a0;
  double local_1198;
  double dStack_1190;
  double local_1188;
  double dStack_1180;
  double local_1178;
  double dStack_1170;
  double local_1168;
  double dStack_1160;
  double local_1158;
  double dStack_1150;
  double local_1148;
  double dStack_1140;
  double local_1138;
  double dStack_1130;
  double local_1128;
  double dStack_1120;
  double local_1118;
  double dStack_1110;
  double local_1108;
  double dStack_1100;
  double local_10f8;
  double local_10f0;
  bearingVector_t f2;
  Vector3d t1;
  Matrix3d F;
  Vector3d pointsCenter1;
  undefined1 auStack_1030 [40];
  Vector3d pointsCenter2;
  undefined1 auStack_fe0 [40];
  Matrix<double,_9,_9,_0,_9,_9> m22P;
  Matrix<double,_9,_9,_0,_9,_9> m12P;
  Matrix<double,_9,_9,_0,_9,_9> m11P;
  Matrix<double,_3,_9,_0,_3,_9> z2P;
  Matrix<double,_3,_9,_0,_3,_9> y2P;
  Matrix<double,_3,_9,_0,_3,_9> x2P;
  Matrix<double,_3,_9,_0,_3,_9> z1P;
  Matrix<double,_3,_9,_0,_3,_9> y1P;
  Matrix3d zxF;
  Matrix3d yzF;
  Matrix3d xyF;
  Matrix3d zzF;
  Matrix3d yyF;
  Matrix3d xxF;
  Vector3d t2;
  Matrix<double,_3,_9,_0,_3,_9> x1P;
  
  sVar4 = indices->_numberCorrespondences;
  xxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] = 0.0;
  z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array._0_64_ =
       ZEXT864(0) << 0x40;
  yyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] = 0.0;
  zzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] = 0.0;
  xyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] = 0.0;
  yzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] = 0.0;
  zxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] = 0.0;
  x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x18] =
       0.0;
  x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x19] =
       0.0;
  x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x1a] =
       0.0;
  z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x10] =
       0.0;
  x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x11] =
       0.0;
  x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x12] =
       0.0;
  x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x13] =
       0.0;
  x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x14] =
       0.0;
  y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x18] =
       0.0;
  z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x19] =
       0.0;
  y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x1a] =
       0.0;
  auVar57 = ZEXT1664(in_ZMM4._0_16_);
  z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array._64_64_ =
       z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array.
       _0_64_;
  z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x11] =
       x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x11]
  ;
  z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x12] =
       x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x12]
  ;
  z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x13] =
       x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x13]
  ;
  z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x14] =
       x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x14]
  ;
  z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x15] =
       y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x18]
  ;
  z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x16] =
       z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x19]
  ;
  z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x17] =
       y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x1a]
  ;
  z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x18] =
       y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x18]
  ;
  z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x19] =
       z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x19]
  ;
  z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x1a] =
       y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x1a]
  ;
  y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array._0_64_ =
       z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array.
       _0_64_;
  y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array._64_64_ =
       z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array.
       _0_64_;
  y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x10] =
       z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x10]
  ;
  y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x11] =
       x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x11]
  ;
  y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x12] =
       x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x12]
  ;
  y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x13] =
       x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x13]
  ;
  y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x14] =
       x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x14]
  ;
  y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x15] =
       y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x18]
  ;
  y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x16] =
       z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x19]
  ;
  y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x17] =
       y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x1a]
  ;
  y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x18] =
       y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x18]
  ;
  y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x19] =
       z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x19]
  ;
  x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array._0_64_ =
       z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array.
       _0_64_;
  x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array._64_64_ =
       z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array.
       _0_64_;
  x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x10] =
       z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x10]
  ;
  x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x11] =
       x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x11]
  ;
  x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x12] =
       x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x12]
  ;
  x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x13] =
       x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x13]
  ;
  x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x14] =
       x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x14]
  ;
  x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x15] =
       y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x18]
  ;
  x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x16] =
       z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x19]
  ;
  x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x17] =
       x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x1a]
  ;
  x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x18] =
       y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x18]
  ;
  x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x19] =
       z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x19]
  ;
  x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x1a] =
       x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x1a]
  ;
  z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array._0_64_ =
       z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array.
       _0_64_;
  z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array._64_64_ =
       z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array.
       _0_64_;
  z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x10] =
       z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x10]
  ;
  z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x11] =
       x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x11]
  ;
  z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x12] =
       x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x12]
  ;
  z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x13] =
       x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x13]
  ;
  z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x14] =
       x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x14]
  ;
  z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x15] =
       y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x18]
  ;
  z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x16] =
       z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x19]
  ;
  z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x17] =
       x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x1a]
  ;
  z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x18] =
       y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x18]
  ;
  z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x1a] =
       x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x1a]
  ;
  y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array._0_64_ =
       z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array.
       _0_64_;
  y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array._64_64_ =
       z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array.
       _0_64_;
  y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x10] =
       z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x10]
  ;
  y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x11] =
       x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x11]
  ;
  y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x12] =
       x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x12]
  ;
  y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x13] =
       x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x13]
  ;
  y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x14] =
       x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x14]
  ;
  y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x15] =
       y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x18]
  ;
  y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x16] =
       x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x19]
  ;
  y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x17] =
       x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x1a]
  ;
  y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x19] =
       x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x19]
  ;
  y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x1a] =
       x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x1a]
  ;
  zxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array._0_64_ =
       z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array.
       _0_64_;
  yzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array._0_64_ =
       z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array.
       _0_64_;
  xyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array._0_64_ =
       z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array.
       _0_64_;
  zzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array._0_64_ =
       z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array.
       _0_64_;
  yyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array._0_64_ =
       z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array.
       _0_64_;
  xxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array._0_64_ =
       z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array.
       _0_64_;
  x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array._0_64_ =
       z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array.
       _0_64_;
  x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array._64_64_ =
       z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array.
       _0_64_;
  x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x10] =
       z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x10]
  ;
  x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x15] =
       x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x18]
  ;
  x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x16] =
       x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x19]
  ;
  x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x17] =
       x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0x1a]
  ;
  memset(&m11P,0,0x288);
  memset(&m12P,0,0x288);
  memset(&m22P,0,0x288);
  auVar55 = ZEXT816(0) << 0x40;
  dVar61 = 0.0;
  if (sVar4 != 0) {
    lVar49 = 0;
    sVar54 = 0;
    do {
      if (indices->_useIndices == false) {
        iVar53 = (int)sVar54;
      }
      else {
        iVar53 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start + (lVar49 >> 0x1e));
      }
      dVar72 = dVar61;
      (*adapter->_vptr_RelativeAdapterBase[4])(adapter,(long)iVar53);
      dVar61 = dVar61 + dVar72 * dVar72;
      auVar55._8_8_ = 0;
      auVar55._0_8_ = dVar61;
      sVar54 = sVar54 + 1;
      lVar49 = lVar49 + 0x100000000;
    } while (sVar4 != sVar54);
  }
  if (auVar55._0_8_ < 0.0) {
    dVar61 = sqrt(auVar55._0_8_);
  }
  else {
    auVar55 = vsqrtsd_avx(auVar55,auVar55);
    dVar61 = auVar55._0_8_;
  }
  if (sVar4 != 0) {
    sVar54 = 0;
    do {
      dVar72 = 1.0;
      local_10f0 = 1.0;
      iVar53 = (int)sVar54;
      if (useWeights) {
        iVar51 = iVar53;
        if (indices->_useIndices == true) {
          iVar51 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start[iVar53];
        }
        (*adapter->_vptr_RelativeAdapterBase[4])(adapter,(long)iVar51);
        local_10f0 = dVar72 / dVar61;
      }
      iVar51 = iVar53;
      if (indices->_useIndices == true) {
        iVar51 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[iVar53];
      }
      (*adapter->_vptr_RelativeAdapterBase[6])(&startingRotation,adapter,(long)iVar51);
      iVar51 = iVar53;
      if (indices->_useIndices == true) {
        iVar51 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[iVar53];
      }
      (*adapter->_vptr_RelativeAdapterBase[2])(&F,adapter,(long)iVar51);
      auVar82._0_8_ =
           F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0]
           * startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[0];
      auVar82._8_8_ =
           F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0]
           * startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[1];
      auVar69._8_8_ =
           F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1];
      auVar69._0_8_ =
           F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1];
      auVar56._8_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[4];
      auVar56._0_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[3];
      auVar55 = vfmadd231pd_fma(auVar82,auVar69,auVar56);
      auVar74._8_8_ =
           F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2];
      auVar74._0_8_ =
           F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2];
      auVar12._8_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[7];
      auVar12._0_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[6];
      auVar55 = vfmadd231pd_fma(auVar55,auVar74,auVar12);
      dVar72 = F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
               [0] * startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array[2];
      dVar73 = F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
               [1] * startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array[5];
      dVar81 = F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
               [2] * startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array[8];
      iVar51 = iVar53;
      if (indices->_useIndices == true) {
        iVar51 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[iVar53];
      }
      (*adapter->_vptr_RelativeAdapterBase[8])(&startingRotation,adapter,(long)iVar51);
      iVar51 = iVar53;
      if (indices->_useIndices == true) {
        iVar51 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[iVar53];
      }
      dVar72 = dVar81 + dVar73 + dVar72;
      (*adapter->_vptr_RelativeAdapterBase[3])(&F,adapter,(long)iVar51);
      auVar63._0_8_ =
           F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0]
           * startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[0];
      auVar63._8_8_ =
           F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0]
           * startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[1];
      auVar75._8_8_ =
           F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1];
      auVar75._0_8_ =
           F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1];
      auVar28._8_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[4];
      auVar28._0_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[3];
      auVar56 = vfmadd231pd_fma(auVar63,auVar75,auVar28);
      auVar83._8_8_ =
           F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2];
      auVar83._0_8_ =
           F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2];
      auVar33._8_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[7];
      auVar33._0_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[6];
      auVar56 = vfmadd231pd_fma(auVar56,auVar83,auVar33);
      f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
           auVar56._0_8_;
      f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
           auVar56._8_8_;
      f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
           F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0]
           * startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[2] +
           F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1]
           * startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[5] +
           F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2]
           * startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[8];
      pdVar45 = F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 2;
      lVar49 = 0;
      do {
        dVar73 = f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[lVar49];
        ((plain_array<double,_9,_0,_0> *)(pdVar45 + -2))->array[0] =
             f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             [0] * dVar73;
        pdVar45[-1] = f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                      m_data.array[1] * dVar73;
        *pdVar45 = f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                   array[2] * dVar73;
        auVar44 = (undefined1  [64])
                  xxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                  array._0_64_;
        auVar43 = (undefined1  [64])
                  yyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                  array._0_64_;
        auVar60 = (undefined1  [64])
                  zzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                  array._0_64_;
        auVar59 = (undefined1  [64])
                  xyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                  array._0_64_;
        auVar58 = (undefined1  [64])
                  yzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                  array._0_64_;
        auVar57 = (undefined1  [64])
                  zxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                  array._0_64_;
        lVar49 = lVar49 + 1;
        pdVar45 = pdVar45 + 3;
      } while (lVar49 != 3);
      dVar80 = auVar55._0_8_;
      dVar73 = local_10f0 * dVar80;
      dVar81 = dVar80 * dVar73;
      xxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
           dVar81 * F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[1] +
           xxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [1];
      xxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
           dVar81 * F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[0] +
           xxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [0];
      xxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
           auVar44._16_8_;
      xxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
           auVar44._24_8_;
      xxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
           dVar81 * F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[2] +
           xxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [2];
      xxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
           dVar81 * F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[3] +
           xxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [3];
      xxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
           auVar44._32_8_;
      xxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
           auVar44._40_8_;
      xxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
           dVar81 * F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[4] +
           xxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [4];
      xxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
           dVar81 * F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[5] +
           xxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [5];
      xxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
           auVar44._48_8_;
      xxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
           auVar44._56_8_;
      xxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
           dVar81 * F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[6] +
           xxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [6];
      xxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
           dVar81 * F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[7] +
           xxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [7];
      xxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
           dVar81 * F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[8] +
           xxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [8];
      auVar56 = vshufpd_avx(auVar55,auVar55,1);
      dVar91 = auVar56._0_8_;
      dVar81 = local_10f0 * dVar91;
      dVar68 = dVar91 * dVar81;
      yyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
           dVar68 * F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[1] +
           yyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [1];
      yyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
           dVar68 * F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[0] +
           yyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [0];
      yyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
           auVar43._16_8_;
      yyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
           auVar43._24_8_;
      yyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
           dVar68 * F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[2] +
           yyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [2];
      yyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
           dVar68 * F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[3] +
           yyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [3];
      yyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
           auVar43._32_8_;
      yyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
           auVar43._40_8_;
      yyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
           dVar68 * F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[4] +
           yyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [4];
      yyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
           dVar68 * F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[5] +
           yyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [5];
      yyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
           auVar43._48_8_;
      yyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
           auVar43._56_8_;
      yyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
           dVar68 * F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[6] +
           yyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [6];
      yyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
           dVar68 * F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[7] +
           yyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [7];
      yyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
           dVar68 * F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[8] +
           yyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [8];
      local_10f0 = local_10f0 * dVar72;
      dVar68 = dVar72 * local_10f0;
      zzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
           dVar68 * F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[1] +
           zzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [1];
      zzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
           dVar68 * F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[0] +
           zzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [0];
      zzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
           auVar60._16_8_;
      zzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
           auVar60._24_8_;
      zzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
           dVar68 * F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[2] +
           zzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [2];
      zzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
           dVar68 * F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[3] +
           zzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [3];
      zzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
           auVar60._32_8_;
      zzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
           auVar60._40_8_;
      zzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
           dVar68 * F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[4] +
           zzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [4];
      zzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
           dVar68 * F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[5] +
           zzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [5];
      zzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
           auVar60._48_8_;
      zzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
           auVar60._56_8_;
      zzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
           dVar68 * F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[6] +
           zzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [6];
      zzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
           dVar68 * F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[7] +
           zzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [7];
      zzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
           dVar68 * F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[8] +
           zzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [8];
      dVar68 = dVar91 * dVar73;
      xyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
           dVar68 * F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[1] +
           xyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [1];
      xyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
           dVar68 * F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[0] +
           xyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [0];
      xyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
           auVar59._16_8_;
      xyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
           auVar59._24_8_;
      xyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
           dVar68 * F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[2] +
           xyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [2];
      xyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
           dVar68 * F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[3] +
           xyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [3];
      xyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
           auVar59._32_8_;
      xyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
           auVar59._40_8_;
      xyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
           dVar68 * F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[4] +
           xyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [4];
      xyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
           dVar68 * F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[5] +
           xyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [5];
      xyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
           auVar59._48_8_;
      xyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
           auVar59._56_8_;
      xyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
           dVar68 * F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[6] +
           xyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [6];
      xyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
           dVar68 * F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[7] +
           xyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [7];
      xyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
           dVar68 * F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[8] +
           xyF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [8];
      dVar68 = dVar81 * dVar72;
      yzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
           dVar68 * F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[1] +
           yzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [1];
      yzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
           dVar68 * F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[0] +
           yzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [0];
      yzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
           auVar58._16_8_;
      yzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
           auVar58._24_8_;
      yzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
           dVar68 * F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[2] +
           yzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [2];
      yzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
           dVar68 * F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[3] +
           yzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [3];
      yzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
           auVar58._32_8_;
      yzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
           auVar58._40_8_;
      yzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
           dVar68 * F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[4] +
           yzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [4];
      yzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
           dVar68 * F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[5] +
           yzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [5];
      yzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
           auVar58._48_8_;
      yzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
           auVar58._56_8_;
      yzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
           dVar68 * F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[6] +
           yzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [6];
      yzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
           dVar68 * F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[7] +
           yzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [7];
      yzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
           dVar68 * F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[8] +
           yzF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [8];
      dVar68 = dVar80 * local_10f0;
      zxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
           dVar68 * F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[1] +
           zxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [1];
      zxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
           dVar68 * F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[0] +
           zxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [0];
      zxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
           auVar57._16_8_;
      zxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
           auVar57._24_8_;
      zxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
           dVar68 * F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[2] +
           zxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [2];
      zxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
           dVar68 * F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[3] +
           zxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [3];
      zxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
           auVar57._32_8_;
      zxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
           auVar57._40_8_;
      zxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
           dVar68 * F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[4] +
           zxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [4];
      zxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
           dVar68 * F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[5] +
           zxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [5];
      zxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
           auVar57._48_8_;
      zxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
           auVar57._56_8_;
      zxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
           dVar68 * F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[6] +
           zxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [6];
      zxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
           dVar68 * F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[7] +
           zxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [7];
      zxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
           dVar68 * F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[8] +
           zxF.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [8];
      iVar51 = iVar53;
      if (indices->_useIndices == true) {
        iVar51 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[iVar53];
      }
      (*adapter->_vptr_RelativeAdapterBase[5])(&t1,adapter,(long)iVar51);
      if (indices->_useIndices == true) {
        iVar53 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[iVar53];
      }
      (*adapter->_vptr_RelativeAdapterBase[7])(&t2,adapter,(long)iVar53);
      dVar1 = f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
              [1];
      dVar68 = f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
               array[0];
      auVar41._8_8_ = 0;
      auVar41._0_8_ = dVar72;
      auVar57 = vbroadcastsd_avx512f(auVar41);
      auVar56 = vunpcklpd_avx(auVar57._0_16_,auVar55);
      auVar38._8_8_ =
           f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
      ;
      auVar38._0_8_ =
           f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
      ;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                     m_data.array[2];
      auVar58 = vbroadcastsd_avx512f(auVar3);
      auVar85._8_8_ = 0;
      auVar85._0_8_ =
           t1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
      ;
      auVar40._8_8_ =
           t1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
      ;
      auVar40._0_8_ =
           t1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
      ;
      auVar76._0_8_ =
           t1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
           * auVar56._0_8_;
      auVar76._8_8_ =
           t1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
           * auVar56._8_8_;
      auVar56 = vshufpd_avx(auVar55,auVar57._0_16_,1);
      auVar89._8_8_ =
           t1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
      ;
      auVar89._0_8_ =
           t1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
      ;
      auVar12 = vunpcklpd_avx(auVar89,auVar85);
      auVar56 = vfmsub213pd_fma(auVar12,auVar56,auVar76);
      auVar77._8_8_ = 0;
      auVar77._0_8_ =
           dVar91 * t1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                    .array[0];
      auVar12 = vfmsub231sd_fma(auVar77,auVar55,auVar40);
      vinsertf32x4_avx512f(ZEXT1664(auVar56),auVar56,1);
      auVar59 = vbroadcastsd_avx512f(auVar12);
      auVar59 = vpermt2pd_avx512f(_DAT_002597c0,auVar59);
      auVar88._8_8_ = 0;
      auVar88._0_8_ =
           t2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
      ;
      auVar42._8_8_ =
           t2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
      ;
      auVar42._0_8_ =
           t2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
      ;
      auVar56 = vunpcklpd_avx(auVar58._0_16_,auVar38);
      auVar90._8_8_ = 0;
      auVar90._0_8_ =
           t2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
           * f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             [1];
      auVar12 = vfmsub231sd_fma(auVar90,auVar38,auVar42);
      auVar60 = vpermt2pd_avx512f(_DAT_00259800,auVar58);
      _pointsCenter1 = vmulpd_avx512f(auVar59,auVar60);
      dVar62 = auVar58._0_8_;
      auVar78._0_8_ =
           t2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
           * auVar56._0_8_;
      auVar78._8_8_ =
           t2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
           * auVar56._8_8_;
      auVar84._8_8_ =
           t2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
      ;
      auVar84._0_8_ =
           t2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
      ;
      auVar56 = vunpcklpd_avx(auVar84,auVar88);
      auVar39._8_8_ =
           f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
      ;
      auVar39._0_8_ =
           f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
      ;
      auVar56 = vfmsub132pd_fma(auVar56,auVar78,auVar39);
      auVar57 = vpermt2pd_avx512f(_DAT_00259800,auVar57);
      vinsertf32x4_avx512f(ZEXT1664(auVar56),auVar56,1);
      auVar58 = vbroadcastsd_avx512f(auVar12);
      auVar58 = vpermt2pd_avx512f(_DAT_002597c0,auVar58);
      _pointsCenter2 = vmulpd_avx512f(auVar57,auVar58);
      if (useWeights) {
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[0] =
             x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [0];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[1] =
             x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [1];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[2] =
             x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [2];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[3] =
             x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [3];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[4] =
             x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [4];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[5] =
             x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [5];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[6] =
             x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [6];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[7] =
             x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [7];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[8] =
             x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [8];
        dVar72 = dVar73 * f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[0];
        dVar80 = dVar73 * f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[1];
        pdVar45 = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                  m_storage.m_data.array + 2;
        lVar49 = 0;
        do {
          dVar91 = pointsCenter2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                   m_storage.m_data.array[lVar49];
          dVar2 = pdVar45[-1];
          ((plain_array<double,_9,_0,_0> *)(pdVar45 + -2))->array[0] =
               dVar72 * dVar91 + ((plain_array<double,_9,_0,_0> *)(pdVar45 + -2))->array[0];
          pdVar45[-1] = dVar80 * dVar91 + dVar2;
          *pdVar45 = dVar73 * dVar62 * dVar91 + *pdVar45;
          lVar49 = lVar49 + 1;
          pdVar45 = pdVar45 + 3;
        } while (lVar49 != 9);
        x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[1] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[1];
        x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[0];
        x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[2] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[2];
        x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[3] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[3];
        x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[4] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[4];
        x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[5] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[5];
        x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[6] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[6];
        x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[7] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[7];
        x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[8] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[8];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[0] =
             y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [0];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[1] =
             y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [1];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[2] =
             y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [2];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[3] =
             y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [3];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[4] =
             y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [4];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[5] =
             y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [5];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[6] =
             y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [6];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[7] =
             y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [7];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[8] =
             y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [8];
        pdVar45 = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                  m_storage.m_data.array + 2;
        lVar49 = 0;
        do {
          dVar72 = pointsCenter2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                   m_storage.m_data.array[lVar49];
          dVar80 = pdVar45[-1];
          ((plain_array<double,_9,_0,_0> *)(pdVar45 + -2))->array[0] =
               dVar81 * dVar68 * dVar72 + ((plain_array<double,_9,_0,_0> *)(pdVar45 + -2))->array[0]
          ;
          pdVar45[-1] = dVar81 * dVar1 * dVar72 + dVar80;
          *pdVar45 = dVar81 * dVar62 * dVar72 + *pdVar45;
          dVar72 = f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                   array[2];
          lVar49 = lVar49 + 1;
          pdVar45 = pdVar45 + 3;
        } while (lVar49 != 9);
        y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[1] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[1];
        y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[0];
        y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[2] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[2];
        y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[3] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[3];
        y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[4] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[4];
        y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[5] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[5];
        y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[6] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[6];
        y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[7] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[7];
        y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[8] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[8];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[0] =
             z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [0];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[1] =
             z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [1];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[2] =
             z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [2];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[3] =
             z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [3];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[4] =
             z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [4];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[5] =
             z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [5];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[6] =
             z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [6];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[7] =
             z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [7];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[8] =
             z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [8];
        dVar80 = local_10f0 *
                 f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[2];
        pdVar45 = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                  m_storage.m_data.array + 2;
        lVar49 = 0;
        do {
          dVar91 = pointsCenter2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                   m_storage.m_data.array[lVar49];
          dVar62 = pdVar45[-1];
          ((plain_array<double,_9,_0,_0> *)(pdVar45 + -2))->array[0] =
               local_10f0 * dVar68 * dVar91 +
               ((plain_array<double,_9,_0,_0> *)(pdVar45 + -2))->array[0];
          pdVar45[-1] = local_10f0 * dVar1 * dVar91 + dVar62;
          *pdVar45 = dVar80 * dVar91 + *pdVar45;
          dVar62 = f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                   array[1];
          dVar91 = f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                   array[0];
          lVar49 = lVar49 + 1;
          pdVar45 = pdVar45 + 3;
        } while (lVar49 != 9);
        z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[1] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[1];
        z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[0];
        z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[2] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[2];
        z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[3] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[3];
        z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[4] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[4];
        z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[5] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[5];
        z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[6] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[6];
        z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[7] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[7];
        z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[8] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[8];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[0] =
             x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [0];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[1] =
             x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [1];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[2] =
             x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [2];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[3] =
             x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [3];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[4] =
             x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [4];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[5] =
             x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [5];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[6] =
             x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [6];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[7] =
             x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [7];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[8] =
             x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [8];
        auVar86._8_8_ =
             f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             [1];
        auVar86._0_8_ =
             f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             [0];
        dVar68 = dVar73 * f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[0];
        dVar80 = dVar73 * f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[1];
        pdVar45 = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                  m_storage.m_data.array + 2;
        lVar49 = 0;
        do {
          dVar1 = pointsCenter1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array[lVar49];
          dVar2 = pdVar45[-1];
          ((plain_array<double,_9,_0,_0> *)(pdVar45 + -2))->array[0] =
               dVar68 * dVar1 + ((plain_array<double,_9,_0,_0> *)(pdVar45 + -2))->array[0];
          pdVar45[-1] = dVar80 * dVar1 + dVar2;
          *pdVar45 = dVar73 * dVar72 * dVar1 + *pdVar45;
          lVar49 = lVar49 + 1;
          pdVar45 = pdVar45 + 3;
        } while (lVar49 != 9);
        x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[1] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[1];
        x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[0];
        x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[2] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[2];
        x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[3] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[3];
        x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[4] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[4];
        x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[5] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[5];
        x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[6] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[6];
        x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[7] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[7];
        x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[8] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[8];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[0] =
             y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [0];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[1] =
             y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [1];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[2] =
             y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [2];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[3] =
             y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [3];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[4] =
             y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [4];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[5] =
             y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [5];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[6] =
             y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [6];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[7] =
             y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [7];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[8] =
             y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [8];
        pdVar45 = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                  m_storage.m_data.array + 2;
        lVar49 = 0;
        do {
          dVar73 = pointsCenter1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                   m_storage.m_data.array[lVar49];
          dVar68 = pdVar45[-1];
          ((plain_array<double,_9,_0,_0> *)(pdVar45 + -2))->array[0] =
               dVar81 * dVar91 * dVar73 + ((plain_array<double,_9,_0,_0> *)(pdVar45 + -2))->array[0]
          ;
          pdVar45[-1] = dVar81 * dVar62 * dVar73 + dVar68;
          *pdVar45 = dVar81 * dVar72 * dVar73 + *pdVar45;
          lVar49 = lVar49 + 1;
          pdVar45 = pdVar45 + 3;
        } while (lVar49 != 9);
        y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[1] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[1];
        y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[0];
        y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[2] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[2];
        y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[3] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[3];
        y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[4] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[4];
        y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[5] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[5];
        y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[6] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[6];
        y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[7] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[7];
        y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[8] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[8];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[0] =
             z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [0];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[1] =
             z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [1];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[2] =
             z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [2];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[3] =
             z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [3];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[4] =
             z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [4];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[5] =
             z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [5];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[6] =
             z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [6];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[7] =
             z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [7];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[8] =
             z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [8];
        Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
             (Index)(local_10f0 * dVar62);
        Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
             (Index)(local_10f0 *
                    f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                    .array[2]);
        pdVar45 = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                  m_storage.m_data.array + 2;
        lVar49 = 0;
        do {
          dVar72 = pointsCenter1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                   m_storage.m_data.array[lVar49];
          dVar73 = pdVar45[-1];
          ((plain_array<double,_9,_0,_0> *)(pdVar45 + -2))->array[0] =
               local_10f0 * dVar91 * dVar72 +
               ((plain_array<double,_9,_0,_0> *)(pdVar45 + -2))->array[0];
          pdVar45[-1] = (double)Hcross.
                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                m_storage.m_rows * dVar72 + dVar73;
          *pdVar45 = (double)Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                             .m_storage.m_cols * dVar72 + *pdVar45;
          lVar49 = lVar49 + 1;
          pdVar45 = pdVar45 + 3;
        } while (lVar49 != 9);
        z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[1] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[1];
        z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[0];
        z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[2] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[2];
        z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[3] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[3];
        z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[4] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[4];
        z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[5] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[5];
        z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[6] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[6];
        z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[7] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[7];
        z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[8] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[8];
        Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
             (double *)&m11P;
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[0] =
             m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[0];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[1] =
             m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[1];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[2] =
             m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[2];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[3] =
             m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[3];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[4] =
             m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[4];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[5] =
             m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[5];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[6] =
             m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[6];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[7] =
             m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[7];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[8] =
             m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[8];
        Eigen::internal::
        outer_product_selector_run<Eigen::Matrix<double,9,9,0,9,9>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,9,1,0,9,1>const>const,Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>const>,Eigen::Matrix<double,1,9,1,1,9>,Eigen::internal::generic_product_impl<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,9,1,0,9,1>const>const,Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>const>,Eigen::Matrix<double,1,9,1,1,9>,Eigen::DenseShape,Eigen::DenseShape,5>::sub>
                  ((Matrix<double,_9,_9,_0,_9,_9> *)&startingRotation,
                   (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_1,_0,_9,_1>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>
                    *)&Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_rows,(Matrix<double,_1,_9,_1,_1,_9> *)&pointsCenter2,&local_13ca,
                   &local_13c9);
        m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[0];
        m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[1]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[1];
        m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[2]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[2];
        m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[3]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[3];
        m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[4]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[4];
        m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[5]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[5];
        m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[6]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[6];
        m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[7]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[7];
        m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[8]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[8];
        Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
             (double *)&m22P;
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[0] =
             m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[0];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[1] =
             m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[1];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[2] =
             m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[2];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[3] =
             m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[3];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[4] =
             m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[4];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[5] =
             m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[5];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[6] =
             m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[6];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[7] =
             m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[7];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[8] =
             m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[8];
        Eigen::internal::
        outer_product_selector_run<Eigen::Matrix<double,9,9,0,9,9>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,9,1,0,9,1>const>const,Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>const>,Eigen::Matrix<double,1,9,1,1,9>,Eigen::internal::generic_product_impl<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,9,1,0,9,1>const>const,Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>const>,Eigen::Matrix<double,1,9,1,1,9>,Eigen::DenseShape,Eigen::DenseShape,5>::sub>
                  ((Matrix<double,_9,_9,_0,_9,_9> *)&startingRotation,
                   (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_1,_0,_9,_1>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>
                    *)&Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_rows,(Matrix<double,_1,_9,_1,_1,_9> *)&pointsCenter1,&local_13ca,
                   &local_13c9);
        m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[0];
        m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[1]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[1];
        m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[2]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[2];
        m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[3]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[3];
        m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[4]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[4];
        m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[5]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[5];
        m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[6]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[6];
        m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[7]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[7];
        m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[8]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[8];
        Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
             (double *)&m12P;
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[0] =
             m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[0];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[1] =
             m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[1];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[2] =
             m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[2];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[3] =
             m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[3];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[4] =
             m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[4];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[5] =
             m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[5];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[6] =
             m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[6];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[7] =
             m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[7];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[8] =
             m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[8];
        dStack_1330 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[9];
        local_1328 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[10];
        dStack_1320 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0xb];
        dStack_1318 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0xc];
        dStack_1310 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0xd];
        dStack_1308 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0xe];
        dStack_1300 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0xf];
        dStack_12f8 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x10];
        dStack_12f0 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x11];
        local_12e8 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x12];
        dStack_12e0 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x13];
        dStack_12d8 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x14];
        dStack_12d0 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x15];
        dStack_12c8 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x16];
        dStack_12c0 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x17];
        dStack_12b8 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x18];
        dStack_12b0 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x19];
        local_12a8 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x1a];
        dStack_12a0 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x1b];
        local_1298 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x1c];
        dStack_1290 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x1d];
        local_1288 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x1e];
        dStack_1280 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x1f];
        local_1278 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x20];
        dStack_1270 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x21];
        dStack_1268 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x22];
        dStack_1260 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x23];
        dStack_1258 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x24];
        dStack_1250 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x25];
        dStack_1248 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x26];
        dStack_1240 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x27];
        local_1238 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x28];
        dStack_1230 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x29];
        dStack_1228 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x2a];
        dStack_1220 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x2b];
        dStack_1218 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x2c];
        dStack_1210 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x2d];
        dStack_1208 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x2e];
        dStack_1200 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x2f];
        local_11f8 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x30];
        dStack_11f0 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x31];
        dStack_11e8 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x32];
        dStack_11e0 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x33];
        local_11d8 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x34];
        dStack_11d0 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x35];
        local_11c8 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x36];
        dStack_11c0 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x37];
        local_11b8 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x38];
        dStack_11b0 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x39];
        local_11a8 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x3a];
        dStack_11a0 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x3b];
        local_1198 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x3c];
        dStack_1190 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x3d];
        local_1188 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x3e];
        dStack_1180 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x3f];
        local_1178 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x40];
        dStack_1170 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x41];
        local_1168 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x42];
        dStack_1160 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x43];
        local_1158 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x44];
        dStack_1150 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x45];
        local_1148 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x46];
        dStack_1140 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x47];
        local_1138 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x48];
        dStack_1130 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x49];
        local_1128 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x4a];
        dStack_1120 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x4b];
        local_1118 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x4c];
        dStack_1110 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x4d];
        local_1108 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x4e];
        dStack_1100 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x4f];
        local_10f8 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x50];
        auVar57 = ZEXT1664(auVar86);
        Eigen::internal::
        outer_product_selector_run<Eigen::Matrix<double,9,9,0,9,9>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,9,1,0,9,1>const>const,Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>const>,Eigen::Matrix<double,1,9,1,1,9>,Eigen::internal::generic_product_impl<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,9,1,0,9,1>const>const,Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>const>,Eigen::Matrix<double,1,9,1,1,9>,Eigen::DenseShape,Eigen::DenseShape,5>::sub>
                  ((Matrix<double,_9,_9,_0,_9,_9> *)&startingRotation,
                   (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_1,_0,_9,_1>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>
                    *)&Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_rows,(Matrix<double,_1,_9,_1,_1,_9> *)&pointsCenter2,&local_13ca,
                   &local_13c9);
      }
      else {
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[0] =
             x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [0];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[1] =
             x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [1];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[2] =
             x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [2];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[3] =
             x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [3];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[4] =
             x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [4];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[5] =
             x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [5];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[6] =
             x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [6];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[7] =
             x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [7];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[8] =
             x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [8];
        dVar73 = dVar80 * f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[0];
        dVar81 = dVar80 * f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[1];
        pdVar45 = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                  m_storage.m_data.array + 2;
        lVar49 = 0;
        do {
          dVar2 = pointsCenter2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array[lVar49];
          dVar21 = pdVar45[-1];
          ((plain_array<double,_9,_0,_0> *)(pdVar45 + -2))->array[0] =
               dVar73 * dVar2 + ((plain_array<double,_9,_0,_0> *)(pdVar45 + -2))->array[0];
          pdVar45[-1] = dVar81 * dVar2 + dVar21;
          *pdVar45 = dVar80 * dVar62 * dVar2 + *pdVar45;
          lVar49 = lVar49 + 1;
          pdVar45 = pdVar45 + 3;
        } while (lVar49 != 9);
        x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[1] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[1];
        x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[0];
        x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[2] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[2];
        x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[3] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[3];
        x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[4] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[4];
        x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[5] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[5];
        x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[6] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[6];
        x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[7] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[7];
        x1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[8] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[8];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[0] =
             y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [0];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[1] =
             y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [1];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[2] =
             y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [2];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[3] =
             y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [3];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[4] =
             y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [4];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[5] =
             y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [5];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[6] =
             y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [6];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[7] =
             y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [7];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[8] =
             y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [8];
        auVar55 = vshufpd_avx(auVar55,auVar55,3);
        pdVar45 = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                  m_storage.m_data.array + 2;
        lVar49 = 0;
        do {
          dVar73 = pointsCenter2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                   m_storage.m_data.array[lVar49];
          dVar81 = pdVar45[-1];
          ((plain_array<double,_9,_0,_0> *)(pdVar45 + -2))->array[0] =
               auVar55._0_8_ * dVar68 * dVar73 +
               ((plain_array<double,_9,_0,_0> *)(pdVar45 + -2))->array[0];
          pdVar45[-1] = auVar55._8_8_ * dVar1 * dVar73 + dVar81;
          *pdVar45 = dVar91 * dVar62 * dVar73 + *pdVar45;
          dVar73 = f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                   array[2];
          lVar49 = lVar49 + 1;
          pdVar45 = pdVar45 + 3;
        } while (lVar49 != 9);
        y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[1] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[1];
        y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[0];
        y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[2] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[2];
        y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[3] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[3];
        y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[4] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[4];
        y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[5] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[5];
        y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[6] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[6];
        y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[7] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[7];
        y1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[8] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[8];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[0] =
             z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [0];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[1] =
             z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [1];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[2] =
             z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [2];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[3] =
             z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [3];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[4] =
             z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [4];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[5] =
             z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [5];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[6] =
             z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [6];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[7] =
             z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [7];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[8] =
             z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [8];
        dVar81 = dVar72 * f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[2];
        pdVar45 = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                  m_storage.m_data.array + 2;
        lVar49 = 0;
        do {
          dVar62 = pointsCenter2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                   m_storage.m_data.array[lVar49];
          dVar2 = pdVar45[-1];
          ((plain_array<double,_9,_0,_0> *)(pdVar45 + -2))->array[0] =
               dVar72 * dVar68 * dVar62 + ((plain_array<double,_9,_0,_0> *)(pdVar45 + -2))->array[0]
          ;
          pdVar45[-1] = dVar72 * dVar1 * dVar62 + dVar2;
          *pdVar45 = dVar81 * dVar62 + *pdVar45;
          dVar2 = f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array[1];
          dVar62 = f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                   array[0];
          lVar49 = lVar49 + 1;
          pdVar45 = pdVar45 + 3;
        } while (lVar49 != 9);
        z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[1] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[1];
        z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[0];
        z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[2] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[2];
        z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[3] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[3];
        z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[4] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[4];
        z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[5] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[5];
        z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[6] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[6];
        z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[7] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[7];
        z1P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[8] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[8];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[0] =
             x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [0];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[1] =
             x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [1];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[2] =
             x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [2];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[3] =
             x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [3];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[4] =
             x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [4];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[5] =
             x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [5];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[6] =
             x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [6];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[7] =
             x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [7];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[8] =
             x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [8];
        auVar87._8_8_ =
             f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             [1];
        auVar87._0_8_ =
             f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             [0];
        dVar81 = dVar80 * f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[0];
        dVar68 = dVar80 * f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[1];
        pdVar45 = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                  m_storage.m_data.array + 2;
        lVar49 = 0;
        do {
          dVar1 = pointsCenter1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array[lVar49];
          dVar21 = pdVar45[-1];
          ((plain_array<double,_9,_0,_0> *)(pdVar45 + -2))->array[0] =
               dVar81 * dVar1 + ((plain_array<double,_9,_0,_0> *)(pdVar45 + -2))->array[0];
          pdVar45[-1] = dVar68 * dVar1 + dVar21;
          *pdVar45 = dVar80 * dVar73 * dVar1 + *pdVar45;
          lVar49 = lVar49 + 1;
          pdVar45 = pdVar45 + 3;
        } while (lVar49 != 9);
        x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[1] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[1];
        x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[0];
        x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[2] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[2];
        x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[3] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[3];
        x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[4] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[4];
        x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[5] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[5];
        x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[6] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[6];
        x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[7] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[7];
        x2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[8] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[8];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[0] =
             y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [0];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[1] =
             y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [1];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[2] =
             y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [2];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[3] =
             y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [3];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[4] =
             y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [4];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[5] =
             y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [5];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[6] =
             y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [6];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[7] =
             y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [7];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[8] =
             y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [8];
        pdVar45 = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                  m_storage.m_data.array + 2;
        lVar49 = 0;
        do {
          dVar81 = pointsCenter1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                   m_storage.m_data.array[lVar49];
          dVar68 = pdVar45[-1];
          ((plain_array<double,_9,_0,_0> *)(pdVar45 + -2))->array[0] =
               auVar55._0_8_ * dVar62 * dVar81 +
               ((plain_array<double,_9,_0,_0> *)(pdVar45 + -2))->array[0];
          pdVar45[-1] = auVar55._8_8_ * dVar2 * dVar81 + dVar68;
          *pdVar45 = dVar91 * dVar73 * dVar81 + *pdVar45;
          lVar49 = lVar49 + 1;
          pdVar45 = pdVar45 + 3;
        } while (lVar49 != 9);
        y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[1] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[1];
        y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[0];
        y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[2] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[2];
        y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[3] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[3];
        y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[4] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[4];
        y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[5] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[5];
        y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[6] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[6];
        y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[7] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[7];
        y2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[8] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[8];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[0] =
             z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [0];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[1] =
             z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [1];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[2] =
             z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [2];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[3] =
             z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [3];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[4] =
             z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [4];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[5] =
             z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [5];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[6] =
             z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [6];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[7] =
             z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [7];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[8] =
             z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array
             [8];
        dVar73 = dVar72 * f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[2];
        pdVar45 = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                  m_storage.m_data.array + 2;
        lVar49 = 0;
        do {
          dVar81 = pointsCenter1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                   m_storage.m_data.array[lVar49];
          dVar68 = pdVar45[-1];
          ((plain_array<double,_9,_0,_0> *)(pdVar45 + -2))->array[0] =
               dVar72 * dVar62 * dVar81 + ((plain_array<double,_9,_0,_0> *)(pdVar45 + -2))->array[0]
          ;
          pdVar45[-1] = dVar72 * dVar2 * dVar81 + dVar68;
          *pdVar45 = dVar73 * dVar81 + *pdVar45;
          lVar49 = lVar49 + 1;
          pdVar45 = pdVar45 + 3;
        } while (lVar49 != 9);
        z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[1] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[1];
        z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[0];
        z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[2] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[2];
        z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[3] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[3];
        z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[4] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[4];
        z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[5] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[5];
        z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[6] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[6];
        z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[7] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[7];
        z2P.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[8] =
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[8];
        Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
             (double *)&m11P;
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[0] =
             m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[0];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[1] =
             m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[1];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[2] =
             m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[2];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[3] =
             m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[3];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[4] =
             m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[4];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[5] =
             m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[5];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[6] =
             m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[6];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[7] =
             m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[7];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[8] =
             m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[8];
        Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
             (Index)&pointsCenter2;
        Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
             (Index)&pointsCenter2;
        Eigen::internal::
        outer_product_selector_run<Eigen::Matrix<double,9,9,0,9,9>,Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>,Eigen::Matrix<double,1,9,1,1,9>,Eigen::internal::generic_product_impl<Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>,Eigen::Matrix<double,1,9,1,1,9>,Eigen::DenseShape,Eigen::DenseShape,5>::sub>
                  ((Matrix<double,_9,_9,_0,_9,_9> *)&startingRotation,
                   (Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *)
                   &Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_rows,(Matrix<double,_1,_9,_1,_1,_9> *)&pointsCenter2,
                   (sub *)&local_13ca,&local_13c9);
        m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[0];
        m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[1]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[1];
        m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[2]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[2];
        m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[3]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[3];
        m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[4]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[4];
        m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[5]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[5];
        m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[6]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[6];
        m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[7]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[7];
        m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[8]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[8];
        Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
             (double *)&m22P;
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[0] =
             m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[0];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[1] =
             m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[1];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[2] =
             m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[2];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[3] =
             m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[3];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[4] =
             m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[4];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[5] =
             m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[5];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[6] =
             m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[6];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[7] =
             m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[7];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[8] =
             m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[8];
        Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
             (Index)&pointsCenter1;
        Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
             (Index)&pointsCenter1;
        Eigen::internal::
        outer_product_selector_run<Eigen::Matrix<double,9,9,0,9,9>,Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>,Eigen::Matrix<double,1,9,1,1,9>,Eigen::internal::generic_product_impl<Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>,Eigen::Matrix<double,1,9,1,1,9>,Eigen::DenseShape,Eigen::DenseShape,5>::sub>
                  ((Matrix<double,_9,_9,_0,_9,_9> *)&startingRotation,
                   (Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *)
                   &Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_rows,(Matrix<double,_1,_9,_1,_1,_9> *)&pointsCenter1,
                   (sub *)&local_13ca,&local_13c9);
        m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[0];
        m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[1]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[1];
        m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[2]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[2];
        m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[3]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[3];
        m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[4]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[4];
        m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[5]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[5];
        m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[6]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[6];
        m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[7]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[7];
        m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[8]
             = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[8];
        Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
             (double *)&m12P;
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[0] =
             m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[0];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[1] =
             m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[1];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[2] =
             m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[2];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[3] =
             m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[3];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[4] =
             m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[4];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[5] =
             m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[5];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[6] =
             m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[6];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[7] =
             m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[7];
        startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[8] =
             m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.
             array[8];
        dStack_1330 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[9];
        local_1328 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[10];
        dStack_1320 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0xb];
        dStack_1318 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0xc];
        dStack_1310 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0xd];
        dStack_1308 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0xe];
        dStack_1300 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0xf];
        dStack_12f8 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x10];
        dStack_12f0 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x11];
        local_12e8 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x12];
        dStack_12e0 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x13];
        dStack_12d8 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x14];
        dStack_12d0 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x15];
        dStack_12c8 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x16];
        dStack_12c0 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x17];
        dStack_12b8 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x18];
        dStack_12b0 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x19];
        local_12a8 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x1a];
        dStack_12a0 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x1b];
        local_1298 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x1c];
        dStack_1290 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x1d];
        local_1288 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x1e];
        dStack_1280 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x1f];
        local_1278 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x20];
        dStack_1270 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x21];
        dStack_1268 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x22];
        dStack_1260 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x23];
        dStack_1258 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x24];
        dStack_1250 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x25];
        dStack_1248 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x26];
        dStack_1240 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x27];
        local_1238 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x28];
        dStack_1230 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x29];
        dStack_1228 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x2a];
        dStack_1220 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x2b];
        dStack_1218 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x2c];
        dStack_1210 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x2d];
        dStack_1208 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x2e];
        dStack_1200 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x2f];
        local_11f8 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x30];
        dStack_11f0 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x31];
        dStack_11e8 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x32];
        dStack_11e0 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x33];
        local_11d8 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x34];
        dStack_11d0 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x35];
        local_11c8 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x36];
        dStack_11c0 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x37];
        local_11b8 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x38];
        dStack_11b0 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x39];
        local_11a8 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x3a];
        dStack_11a0 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x3b];
        local_1198 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x3c];
        dStack_1190 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x3d];
        local_1188 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x3e];
        dStack_1180 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x3f];
        local_1178 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x40];
        dStack_1170 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x41];
        local_1168 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x42];
        dStack_1160 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x43];
        local_1158 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x44];
        dStack_1150 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x45];
        local_1148 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x46];
        dStack_1140 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x47];
        local_1138 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x48];
        dStack_1130 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x49];
        local_1128 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x4a];
        dStack_1120 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x4b];
        local_1118 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x4c];
        dStack_1110 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x4d];
        local_1108 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x4e];
        dStack_1100 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                      m_data.array[0x4f];
        local_10f8 = m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.
                     m_data.array[0x50];
        auVar57 = ZEXT1664(auVar87);
        Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
             (Index)&pointsCenter1;
        Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
             (Index)&pointsCenter2;
        Eigen::internal::
        outer_product_selector_run<Eigen::Matrix<double,9,9,0,9,9>,Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>,Eigen::Matrix<double,1,9,1,1,9>,Eigen::internal::generic_product_impl<Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>,Eigen::Matrix<double,1,9,1,1,9>,Eigen::DenseShape,Eigen::DenseShape,5>::sub>
                  ((Matrix<double,_9,_9,_0,_9,_9> *)&startingRotation,
                   (Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *)
                   &Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_rows,(Matrix<double,_1,_9,_1,_1,_9> *)&pointsCenter2,
                   (sub *)&local_13ca,&local_13c9);
      }
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0] =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[0];
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[1] =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[1];
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[2] =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[2];
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[3] =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[3];
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[4] =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[4];
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[5] =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[5];
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[6] =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[6];
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[7] =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[7];
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[8] =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[8];
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[9] =
           dStack_1330;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[10] =
           local_1328;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0xb]
           = dStack_1320;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0xc]
           = dStack_1318;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0xd]
           = dStack_1310;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0xe]
           = dStack_1308;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0xf]
           = dStack_1300;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x10]
           = dStack_12f8;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x11]
           = dStack_12f0;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x12]
           = local_12e8;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x13]
           = dStack_12e0;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x14]
           = dStack_12d8;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x15]
           = dStack_12d0;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x16]
           = dStack_12c8;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x17]
           = dStack_12c0;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x18]
           = dStack_12b8;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x19]
           = dStack_12b0;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x1a]
           = local_12a8;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x1b]
           = dStack_12a0;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x1c]
           = local_1298;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x1d]
           = dStack_1290;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x1e]
           = local_1288;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x1f]
           = dStack_1280;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x20]
           = local_1278;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x21]
           = dStack_1270;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x22]
           = dStack_1268;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x23]
           = dStack_1260;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x24]
           = dStack_1258;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x25]
           = dStack_1250;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x26]
           = dStack_1248;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x27]
           = dStack_1240;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x29]
           = dStack_1230;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x28]
           = local_1238;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x2a]
           = dStack_1228;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x2b]
           = dStack_1220;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x2c]
           = dStack_1218;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x2d]
           = dStack_1210;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x2e]
           = dStack_1208;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x2f]
           = dStack_1200;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x30]
           = local_11f8;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x31]
           = dStack_11f0;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x32]
           = dStack_11e8;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x33]
           = dStack_11e0;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x34]
           = local_11d8;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x35]
           = dStack_11d0;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x36]
           = local_11c8;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x37]
           = dStack_11c0;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x38]
           = local_11b8;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x39]
           = dStack_11b0;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x3a]
           = local_11a8;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x3b]
           = dStack_11a0;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x3c]
           = local_1198;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x3d]
           = dStack_1190;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x3e]
           = local_1188;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x3f]
           = dStack_1180;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x40]
           = local_1178;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x41]
           = dStack_1170;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x42]
           = local_1168;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x43]
           = dStack_1160;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x44]
           = local_1158;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x45]
           = dStack_1150;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x46]
           = local_1148;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x47]
           = dStack_1140;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x48]
           = local_1138;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x49]
           = dStack_1130;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x4a]
           = local_1128;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x4b]
           = dStack_1120;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x4c]
           = local_1118;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x4d]
           = dStack_1110;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x4e]
           = local_1108;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x4f]
           = dStack_1100;
      m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[0x50]
           = local_10f8;
      sVar54 = sVar54 + 1;
    } while (sVar54 != sVar4);
  }
  auVar55 = auVar57._0_16_;
  pointsCenter1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array.
  _0_16_ = ZEXT816(0);
  pointsCenter1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [2] = 0.0;
  pointsCenter2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [2] = 0.0;
  pointsCenter2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array.
  _0_16_ = ZEXT816(0);
  if (sVar4 != 0) {
    lVar49 = 0;
    sVar54 = 0;
    do {
      iVar53 = (int)sVar54;
      lVar47 = lVar49 >> 0x1e;
      iVar51 = iVar53;
      if (indices->_useIndices != false) {
        iVar51 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start + lVar47);
      }
      auVar57 = ZEXT1664(auVar57._0_16_);
      (*adapter->_vptr_RelativeAdapterBase[6])(&startingRotation,adapter,(long)iVar51);
      iVar51 = iVar53;
      if (indices->_useIndices != false) {
        iVar51 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start + lVar47);
      }
      (*adapter->_vptr_RelativeAdapterBase[2])(&F,adapter,(long)iVar51);
      auVar58 = _pointsCenter1;
      auVar29._8_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[4];
      auVar29._0_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[3];
      auVar70._8_8_ =
           F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2];
      auVar70._0_8_ =
           F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2];
      auVar22._8_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[1];
      auVar22._0_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[0];
      auVar26._8_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[3];
      auVar26._0_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[2];
      auVar13._8_8_ =
           F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0];
      auVar13._0_8_ =
           F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0];
      auVar55 = vmulpd_avx512vl(auVar22,auVar13);
      auVar14._8_8_ =
           F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1];
      auVar14._0_8_ =
           F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1];
      auVar55 = vfmadd231pd_avx512vl(auVar55,auVar29,auVar14);
      auVar34._8_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[7];
      auVar34._0_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[6];
      auVar56 = vfmadd231pd_fma(auVar55,auVar70,auVar34);
      auVar55 = vmovhpd_avx(auVar26,startingRotation.
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                    m_storage.m_data.array[5]);
      auVar64._0_8_ =
           auVar55._0_8_ *
           F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0];
      auVar64._8_8_ =
           auVar55._8_8_ *
           F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1];
      auVar55 = vshufpd_avx(auVar64,auVar64,1);
      pointsCenter1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[1] = auVar56._8_8_ +
                 pointsCenter1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[1];
      pointsCenter1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = auVar56._0_8_ +
                 pointsCenter1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[0];
      pointsCenter1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[2] = auVar58._16_8_;
      auStack_1030 = auVar58._24_40_;
      pointsCenter1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[2] = auVar64._0_8_ +
                 auVar55._0_8_ +
                 F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                 array[2] *
                 startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                 m_storage.m_data.array[8] +
                 pointsCenter1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[2];
      iVar51 = iVar53;
      if (indices->_useIndices != false) {
        iVar51 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start + lVar47);
      }
      (*adapter->_vptr_RelativeAdapterBase[8])(&startingRotation,adapter,(long)iVar51);
      if (indices->_useIndices != false) {
        iVar53 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start + lVar47);
      }
      (*adapter->_vptr_RelativeAdapterBase[3])(&F,adapter,(long)iVar53);
      auVar58 = _pointsCenter2;
      auVar55 = auVar57._0_16_;
      auVar30._8_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[4];
      auVar30._0_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[3];
      auVar71._8_8_ =
           F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2];
      auVar71._0_8_ =
           F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2];
      auVar23._8_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[1];
      auVar23._0_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[0];
      auVar27._8_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[3];
      auVar27._0_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[2];
      auVar15._8_8_ =
           F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0];
      auVar15._0_8_ =
           F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0];
      auVar56 = vmulpd_avx512vl(auVar23,auVar15);
      auVar16._8_8_ =
           F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1];
      auVar16._0_8_ =
           F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1];
      auVar56 = vfmadd231pd_avx512vl(auVar56,auVar30,auVar16);
      auVar35._8_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[7];
      auVar35._0_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[6];
      auVar12 = vfmadd231pd_fma(auVar56,auVar71,auVar35);
      auVar56 = vmovhpd_avx(auVar27,startingRotation.
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                    m_storage.m_data.array[5]);
      auVar65._0_8_ =
           auVar56._0_8_ *
           F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0];
      auVar65._8_8_ =
           auVar56._8_8_ *
           F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1];
      auVar56 = vshufpd_avx(auVar65,auVar65,1);
      pointsCenter2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[1] = auVar12._8_8_ +
                 pointsCenter2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[1];
      pointsCenter2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = auVar12._0_8_ +
                 pointsCenter2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[0];
      pointsCenter2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[2] = auVar58._16_8_;
      auStack_fe0 = auVar58._24_40_;
      pointsCenter2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[2] = auVar65._0_8_ +
                 auVar56._0_8_ +
                 F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                 array[2] *
                 startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                 m_storage.m_data.array[8] +
                 pointsCenter2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[2];
      sVar54 = sVar54 + 1;
      lVar49 = lVar49 + 0x100000000;
    } while (sVar4 != sVar54);
  }
  auVar55 = vcvtusi2sd_avx512f(auVar55,sVar4);
  dVar61 = auVar55._0_8_;
  auVar79._8_8_ = dVar61;
  auVar79._0_8_ = dVar61;
  auVar55 = vdivpd_avx((undefined1  [16])
                       pointsCenter1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                       m_storage.m_data.array._0_16_,auVar79);
  pointsCenter1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [2] = pointsCenter1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[2] / dVar61;
  pointsCenter1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [0] = (double)auVar55._0_8_;
  pointsCenter1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [1] = (double)auVar55._8_8_;
  auVar55 = vdivpd_avx((undefined1  [16])
                       pointsCenter2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                       m_storage.m_data.array._0_16_,auVar79);
  pointsCenter2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [2] = pointsCenter2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[2] / dVar61;
  pointsCenter2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [0] = (double)auVar55._0_8_;
  pointsCenter2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [1] = (double)auVar55._8_8_;
  Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)&Hcross,9,3,3);
  if ((Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows != 3
      ) || (Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
            != 3)) {
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)&Hcross,9,3,3);
  }
  pdVar45 = Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
  ;
  uVar50 = Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
           * Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_cols;
  uVar48 = uVar50 + 7;
  if (-1 < (long)uVar50) {
    uVar48 = uVar50;
  }
  uVar52 = uVar48 & 0xfffffffffffffff8;
  if (7 < (long)uVar50) {
    uVar46 = 8;
    if (8 < (long)uVar52) {
      uVar46 = uVar52;
    }
    memset(Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data,
           0,uVar46 * 8);
  }
  if ((long)uVar52 < (long)uVar50) {
    memset(pdVar45 + ((long)uVar48 >> 3) * 8,0,uVar50 * 8 + ((long)uVar48 >> 3) * -0x40);
  }
  if (sVar4 != 0) {
    sVar54 = 0;
    do {
      iVar51 = (int)sVar54;
      iVar53 = iVar51;
      if (indices->_useIndices == true) {
        iVar53 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[iVar51];
      }
      (*adapter->_vptr_RelativeAdapterBase[6])(&startingRotation,adapter,(long)iVar53);
      iVar53 = iVar51;
      if (indices->_useIndices == true) {
        iVar53 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[iVar51];
      }
      (*adapter->_vptr_RelativeAdapterBase[2])(&t1,adapter,(long)iVar53);
      F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
           (double)(F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array + 2);
      auVar24._8_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[1];
      auVar24._0_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[0];
      auVar17._8_8_ =
           t1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
      ;
      auVar17._0_8_ =
           t1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
      ;
      auVar55 = vmulpd_avx512vl(auVar24,auVar17);
      auVar31._8_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[4];
      auVar31._0_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[3];
      auVar18._8_8_ =
           t1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
      ;
      auVar18._0_8_ =
           t1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
      ;
      auVar55 = vfmadd132pd_avx512vl(auVar31,auVar55,auVar18);
      auVar66._8_8_ =
           t1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
      ;
      auVar66._0_8_ =
           t1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
      ;
      auVar36._8_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[7];
      auVar36._0_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[6];
      F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array._16_16_
           = vfmadd231pd_fma(auVar55,auVar66,auVar36);
      F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[2] *
           t1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
           + startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[5] *
             t1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             [1] + t1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                   array[2] *
                   startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                   m_storage.m_data.array[8];
      auVar55 = vsubpd_avx((undefined1  [16])
                           F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                           m_data.array._16_16_,
                           (undefined1  [16])
                           pointsCenter1.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                           m_data.array._0_16_);
      f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
           auVar55._0_8_;
      f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
           auVar55._8_8_;
      f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
           F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4]
           - pointsCenter1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
             m_data.array[2];
      iVar53 = iVar51;
      if (indices->_useIndices == true) {
        iVar53 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[iVar51];
      }
      F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
           (double)&pointsCenter1;
      (*adapter->_vptr_RelativeAdapterBase[8])(&startingRotation,adapter,(long)iVar53);
      if (indices->_useIndices == true) {
        iVar51 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[iVar51];
      }
      (*adapter->_vptr_RelativeAdapterBase[3])(&t1,adapter,(long)iVar51);
      auVar25._8_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[1];
      auVar25._0_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[0];
      auVar19._8_8_ =
           t1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
      ;
      auVar19._0_8_ =
           t1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
      ;
      auVar55 = vmulpd_avx512vl(auVar25,auVar19);
      auVar32._8_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[4];
      auVar32._0_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[3];
      auVar20._8_8_ =
           t1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
      ;
      auVar20._0_8_ =
           t1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
      ;
      auVar55 = vfmadd132pd_avx512vl(auVar32,auVar55,auVar20);
      auVar67._8_8_ =
           t1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
      ;
      auVar67._0_8_ =
           t1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
      ;
      auVar37._8_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[7];
      auVar37._0_8_ =
           startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[6];
      auVar55 = vfmadd231pd_fma(auVar55,auVar67,auVar37);
      auVar55 = vsubpd_avx(auVar55,(undefined1  [16])
                                   pointsCenter2.
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                   m_storage.m_data.array._0_16_);
      dVar61 = (startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                m_storage.m_data.array[2] *
                t1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array[0] +
               startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[5] *
               t1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
               array[1] +
               t1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
               array[2] *
               startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[8]) -
               pointsCenter2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[2];
      pdVar45 = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                m_storage.m_data.array + 2;
      lVar49 = 0;
      do {
        dVar72 = f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[lVar49];
        ((plain_array<double,_9,_0,_0> *)(pdVar45 + -2))->array[0] = auVar55._0_8_ * dVar72;
        pdVar45[-1] = auVar55._8_8_ * dVar72;
        *pdVar45 = dVar61 * dVar72;
        lVar49 = lVar49 + 1;
        pdVar45 = pdVar45 + 3;
      } while (lVar49 != 3);
      uVar50 = Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_cols * Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_rows;
      uVar48 = uVar50 + 7;
      if (-1 < (long)uVar50) {
        uVar48 = uVar50;
      }
      if (7 < (long)uVar50) {
        lVar49 = 0;
        do {
          auVar57 = vaddpd_avx512f(*(undefined1 (*) [64])
                                    (startingRotation.
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                     m_storage.m_data.array + lVar49),
                                   *(undefined1 (*) [64])
                                    (Hcross.
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                     .m_storage.m_data + lVar49));
          *(undefined1 (*) [64])
           (Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
           + lVar49) = auVar57;
          lVar49 = lVar49 + 8;
        } while (lVar49 < (long)(uVar48 & 0xfffffffffffffff8));
      }
      auVar57 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      if ((long)uVar50 % 8 != 0 && (long)(uVar48 & 0xfffffffffffffff8) <= (long)uVar50) {
        lVar49 = (long)uVar48 >> 3;
        auVar58 = vpbroadcastq_avx512f();
        uVar48 = 0;
        do {
          auVar59 = vpbroadcastq_avx512f();
          auVar59 = vporq_avx512f(auVar59,auVar57);
          uVar52 = vpcmpuq_avx512f(auVar59,auVar58,2);
          pdVar45 = startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                    m_storage.m_data.array + lVar49 * 8 + uVar48;
          bVar5 = (byte)uVar52;
          auVar59._8_8_ = (ulong)((byte)(uVar52 >> 1) & 1) * (long)pdVar45[1];
          auVar59._0_8_ = (ulong)(bVar5 & 1) * (long)*pdVar45;
          auVar59._16_8_ = (ulong)((byte)(uVar52 >> 2) & 1) * (long)pdVar45[2];
          auVar59._24_8_ = (ulong)((byte)(uVar52 >> 3) & 1) * (long)pdVar45[3];
          auVar59._32_8_ = (ulong)((byte)(uVar52 >> 4) & 1) * (long)pdVar45[4];
          auVar59._40_8_ = (ulong)((byte)(uVar52 >> 5) & 1) * (long)pdVar45[5];
          auVar59._48_8_ = (ulong)((byte)(uVar52 >> 6) & 1) * (long)pdVar45[6];
          auVar59._56_8_ = (uVar52 >> 7) * (long)pdVar45[7];
          pdVar45 = Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_data + lVar49 * 8 + uVar48;
          auVar60._8_8_ = (ulong)((byte)(uVar52 >> 1) & 1) * (long)pdVar45[1];
          auVar60._0_8_ = (ulong)(bVar5 & 1) * (long)*pdVar45;
          auVar60._16_8_ = (ulong)((byte)(uVar52 >> 2) & 1) * (long)pdVar45[2];
          auVar60._24_8_ = (ulong)((byte)(uVar52 >> 3) & 1) * (long)pdVar45[3];
          auVar60._32_8_ = (ulong)((byte)(uVar52 >> 4) & 1) * (long)pdVar45[4];
          auVar60._40_8_ = (ulong)((byte)(uVar52 >> 5) & 1) * (long)pdVar45[5];
          auVar60._48_8_ = (ulong)((byte)(uVar52 >> 6) & 1) * (long)pdVar45[6];
          auVar60._56_8_ = (uVar52 >> 7) * (long)pdVar45[7];
          auVar59 = vaddpd_avx512f(auVar59,auVar60);
          pdVar45 = Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_data + lVar49 * 8 + uVar48;
          bVar6 = (bool)((byte)(uVar52 >> 1) & 1);
          bVar7 = (bool)((byte)(uVar52 >> 2) & 1);
          bVar8 = (bool)((byte)(uVar52 >> 3) & 1);
          bVar9 = (bool)((byte)(uVar52 >> 4) & 1);
          bVar10 = (bool)((byte)(uVar52 >> 5) & 1);
          bVar11 = (bool)((byte)(uVar52 >> 6) & 1);
          *pdVar45 = (double)((ulong)(bVar5 & 1) * auVar59._0_8_ |
                             (ulong)!(bool)(bVar5 & 1) * (long)*pdVar45);
          pdVar45[1] = (double)((ulong)bVar6 * auVar59._8_8_ | (ulong)!bVar6 * (long)pdVar45[1]);
          pdVar45[2] = (double)((ulong)bVar7 * auVar59._16_8_ | (ulong)!bVar7 * (long)pdVar45[2]);
          pdVar45[3] = (double)((ulong)bVar8 * auVar59._24_8_ | (ulong)!bVar8 * (long)pdVar45[3]);
          pdVar45[4] = (double)((ulong)bVar9 * auVar59._32_8_ | (ulong)!bVar9 * (long)pdVar45[4]);
          pdVar45[5] = (double)((ulong)bVar10 * auVar59._40_8_ | (ulong)!bVar10 * (long)pdVar45[5]);
          pdVar45[6] = (double)((ulong)bVar11 * auVar59._48_8_ | (ulong)!bVar11 * (long)pdVar45[6]);
          pdVar45[7] = (double)((uVar52 >> 7) * auVar59._56_8_ |
                               (ulong)!SUB81(uVar52 >> 7,0) * (long)pdVar45[7]);
          uVar48 = uVar48 + 8;
        } while (((long)uVar50 % 8 + 7U & 0xfffffffffffffff8) != uVar48);
      }
      sVar54 = sVar54 + 1;
    } while (sVar54 != sVar4);
  }
  math::arun(&startingRotation,&Hcross);
  math::rot2cayley((cayley_t *)&F,&startingRotation);
  modules::ge_main2(&xxF,&yyF,&zzF,&xyF,&yzF,&zxF,&x1P,&y1P,&z1P,&x2P,&y2P,&z2P,&m11P,&m12P,&m22P,
                    (cayley_t *)&F,output);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[8] =
       (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
       m_data.array[8];
  dVar61 = (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
           .m_data.array[1];
  dVar72 = (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
           .m_data.array[2];
  dVar73 = (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
           .m_data.array[3];
  dVar81 = (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
           .m_data.array[4];
  dVar68 = (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
           .m_data.array[5];
  dVar80 = (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
           .m_data.array[6];
  dVar91 = (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
           .m_data.array[7];
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[0] =
       (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
       m_data.array[0];
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[1] = dVar61;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[2] = dVar72;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[3] = dVar73;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[4] = dVar81;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[5] = dVar68;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[6] = dVar80;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[7] = dVar91;
  if (Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data !=
      (double *)0x0) {
    free((void *)Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                 m_data[-1]);
  }
  return __return_storage_ptr__;
}

Assistant:

rotation_t ge(
    const RelativeAdapterBase & adapter,
    const Indices & indices,
    geOutput_t & output,
    bool useWeights )
{ 
  size_t numberCorrespondences = indices.size();
  assert(numberCorrespondences > 5);

  Eigen::Matrix3d xxF = Eigen::Matrix3d::Zero();
  Eigen::Matrix3d yyF = Eigen::Matrix3d::Zero();
  Eigen::Matrix3d zzF = Eigen::Matrix3d::Zero();
  Eigen::Matrix3d xyF = Eigen::Matrix3d::Zero();
  Eigen::Matrix3d yzF = Eigen::Matrix3d::Zero();
  Eigen::Matrix3d zxF = Eigen::Matrix3d::Zero();
  
  Eigen::Matrix<double,3,9> x1P = Eigen::Matrix<double,3,9>::Zero();
  Eigen::Matrix<double,3,9> y1P = Eigen::Matrix<double,3,9>::Zero();
  Eigen::Matrix<double,3,9> z1P = Eigen::Matrix<double,3,9>::Zero();
  Eigen::Matrix<double,3,9> x2P = Eigen::Matrix<double,3,9>::Zero();
  Eigen::Matrix<double,3,9> y2P = Eigen::Matrix<double,3,9>::Zero();
  Eigen::Matrix<double,3,9> z2P = Eigen::Matrix<double,3,9>::Zero();
  
  Eigen::Matrix<double,9,9> m11P = Eigen::Matrix<double,9,9>::Zero();
  Eigen::Matrix<double,9,9> m12P = Eigen::Matrix<double,9,9>::Zero();
  Eigen::Matrix<double,9,9> m22P = Eigen::Matrix<double,9,9>::Zero();

  //compute the norm of all the scores
  double norm = 0.0;
  for(size_t i=0; i < numberCorrespondences; i++)
    norm += pow(adapter.getWeight(indices[i]),2);
  norm = sqrt(norm);

  //Fill summation terms
  for(size_t i=0; i < numberCorrespondences; i++)
  {
    //get the weight of this feature
    double weight = 1.0;
    if( useWeights )
      weight = adapter.getWeight(indices[i])/norm;
    
    //unrotate the bearing vectors
    bearingVector_t f1 = adapter.getCamRotation1(indices[i]) *
        adapter.getBearingVector1(indices[i]);
    bearingVector_t f2 = adapter.getCamRotation2(indices[i]) *
        adapter.getBearingVector2(indices[i]);
    
    //compute the standard summation terms
    Eigen::Matrix3d F = f2*f2.transpose();

    xxF = xxF + weight*f1[0]*f1[0]*F;
    yyF = yyF + weight*f1[1]*f1[1]*F;
    zzF = zzF + weight*f1[2]*f1[2]*F;
    xyF = xyF + weight*f1[0]*f1[1]*F;
    yzF = yzF + weight*f1[1]*f1[2]*F;
    zxF = zxF + weight*f1[2]*f1[0]*F;
    
    //now compute the "cross"-summation terms    
    Eigen::Vector3d t1 = adapter.getCamOffset1(indices[i]);
    Eigen::Vector3d t2 = adapter.getCamOffset2(indices[i]);
    
    Eigen::Matrix<double,1,9> f2_19;
    double temp = f1[1]*t1[2]-f1[2]*t1[1];
    f2_19(0,0) = f2[0] * temp;
    f2_19(0,1) = f2[1] * temp;
    f2_19(0,2) = f2[2] * temp;
    temp = f1[2]*t1[0]-f1[0]*t1[2];
    f2_19(0,3) = f2[0] * temp;
    f2_19(0,4) = f2[1] * temp;
    f2_19(0,5) = f2[2] * temp;
    temp = f1[0]*t1[1]-f1[1]*t1[0];
    f2_19(0,6) = f2[0] * temp;
    f2_19(0,7) = f2[1] * temp;
    f2_19(0,8) = f2[2] * temp;
    
    Eigen::Matrix<double,1,9> f1_19;
    temp = f2[1]*t2[2]-f2[2]*t2[1];
    f1_19(0,0) = f1[0] * temp;
    f1_19(0,1) = f1[1] * temp;
    f1_19(0,2) = f1[2] * temp;
    temp = f2[2]*t2[0]-f2[0]*t2[2];
    f1_19(0,3) = f1[0] * temp;
    f1_19(0,4) = f1[1] * temp;
    f1_19(0,5) = f1[2] * temp;
    temp = f2[0]*t2[1]-f2[1]*t2[0];
    f1_19(0,6) = f1[0] * temp;
    f1_19(0,7) = f1[1] * temp;
    f1_19(0,8) = f1[2] * temp;
    
    if( useWeights )
    {
      x1P = x1P + ( (weight * f1[0]) * f2 ) * f1_19;
      y1P = y1P + ( (weight * f1[1]) * f2 ) * f1_19;
      z1P = z1P + ( (weight * f1[2]) * f2 ) * f1_19;
      
      x2P = x2P + ( (weight * f1[0]) * f2 ) * f2_19;
      y2P = y2P + ( (weight * f1[1]) * f2 ) * f2_19;
      z2P = z2P + ( (weight * f1[2]) * f2 ) * f2_19;
      
      m11P = m11P - ( weight * f1_19.transpose() ) * f1_19;
      m22P = m22P - ( weight * f2_19.transpose() ) * f2_19;
      m12P = m12P - ( weight * f2_19.transpose() ) * f1_19;
    }
    else
    {
      x1P = x1P + ( f1[0] * f2 ) * f1_19;
      y1P = y1P + ( f1[1] * f2 ) * f1_19;
      z1P = z1P + ( f1[2] * f2 ) * f1_19;
      
      x2P = x2P + ( f1[0]) * f2 * f2_19;
      y2P = y2P + ( f1[1]) * f2 * f2_19;
      z2P = z2P + ( f1[2]) * f2 * f2_19;
      
      m11P = m11P - f1_19.transpose() * f1_19;
      m22P = m22P - f2_19.transpose() * f2_19;
      m12P = m12P - f2_19.transpose() * f1_19;
    }
  }

  Eigen::Vector3d pointsCenter1 = Eigen::Vector3d::Zero();
  Eigen::Vector3d pointsCenter2 = Eigen::Vector3d::Zero();

  for( size_t i = 0; i < numberCorrespondences; i++ )
  {
    pointsCenter1 += adapter.getCamRotation1(indices[i]) *
        adapter.getBearingVector1(indices[i]);
    pointsCenter2 += adapter.getCamRotation2(indices[i]) *
        adapter.getBearingVector2(indices[i]);
  }

  pointsCenter1 = pointsCenter1 / numberCorrespondences;
  pointsCenter2 = pointsCenter2 / numberCorrespondences;

  Eigen::MatrixXd Hcross(3,3);
  Hcross = Eigen::Matrix3d::Zero();

  for( size_t i = 0; i < numberCorrespondences; i++ )
  {
    Eigen::Vector3d f =      adapter.getCamRotation1(indices[i]) *
        adapter.getBearingVector1(indices[i]) - pointsCenter1;
    Eigen::Vector3d fprime = adapter.getCamRotation2(indices[i]) *
        adapter.getBearingVector2(indices[i]) - pointsCenter2;
    Hcross += fprime * f.transpose();
  }

  rotation_t startingRotation = math::arun(Hcross);

  //Do minimization
  modules::ge_main2(
      xxF, yyF, zzF, xyF, yzF, zxF,
      x1P, y1P, z1P, x2P, y2P, z2P,
      m11P, m12P, m22P, math::rot2cayley(startingRotation), output);

  return output.rotation;
}